

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O3

void __thiscall
RenX::LadderDatabase::updateLadder(LadderDatabase *this,Server *server,TeamType *team)

{
  PlayerInfo *player;
  int *piVar1;
  long *plVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  _List_node_base *p_Var6;
  undefined4 uVar7;
  undefined4 uVar8;
  TeamType TVar9;
  size_t sVar10;
  _List_node_base *p_Var11;
  Entry *pEVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  size_t sVar16;
  Entry *__s;
  ulong uVar17;
  milliseconds mVar18;
  time_t tVar19;
  long lVar20;
  long lVar21;
  ostream *poVar22;
  size_t in_RCX;
  uint uVar23;
  long lVar24;
  long lVar25;
  string_view msg;
  undefined1 auVar26 [16];
  string str;
  long local_c0;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  string local_50;
  
  sVar10 = (server->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
           _M_impl._M_node._M_size;
  sVar16 = Server::getBotCount(server);
  if (sVar10 != sVar16) {
    if (this->OnPreUpdateLadder != (PreUpdateLadderFunction *)0x0) {
      (*this->OnPreUpdateLadder)(this,server,team);
    }
    for (p_Var11 = (server->players).
                   super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>._M_impl.
                   _M_node.super__List_node_base._M_next;
        p_Var11 != (_List_node_base *)&server->players; p_Var11 = p_Var11->_M_next) {
      if ((p_Var11[0xf]._M_prev != (_List_node_base *)0x0) &&
         (((ulong)p_Var11[0x10]._M_next & 0x400000000) == 0)) {
        pEVar12 = this->m_head;
        for (__s = pEVar12; __s != (Entry *)0x0; __s = __s->next) {
          if ((_List_node_base *)__s->steam_id == p_Var11[0xf]._M_prev) goto LAB_00125f85;
        }
        __s = (Entry *)operator_new(0x140);
        memset(__s,0,0x130);
        (__s->most_recent_name)._M_dataplus._M_p = (pointer)&(__s->most_recent_name).field_2;
        (__s->most_recent_name).field_2._M_local_buf[0] = '\0';
        __s->next = (Entry *)0x0;
        __s->prev = (Entry *)0x0;
        this->m_entries = this->m_entries + 1;
        if (pEVar12 == (Entry *)0x0) {
          this->m_head = __s;
        }
        else {
          pEVar12 = this->m_end;
          pEVar12->next = __s;
          __s->prev = pEVar12;
        }
        this->m_end = __s;
        __s->steam_id = (uint64_t)p_Var11[0xf]._M_prev;
LAB_00125f85:
        uVar17 = (ulong)(double)p_Var11[0x11]._M_prev;
        __s->total_score =
             __s->total_score +
             ((long)((double)p_Var11[0x11]._M_prev - 9.223372036854776e+18) & (long)uVar17 >> 0x3f |
             uVar17);
        player = (PlayerInfo *)(p_Var11 + 1);
        uVar5 = *(undefined8 *)((long)&p_Var11[0x14]._M_next + 4);
        p_Var6 = p_Var11[0x13]._M_prev;
        __s->total_kills = (int)p_Var6 + __s->total_kills;
        __s->total_deaths = (int)((ulong)p_Var6 >> 0x20) + __s->total_deaths;
        __s->total_headshot_kills = (int)uVar5 + __s->total_headshot_kills;
        __s->total_vehicle_kills = (int)((ulong)uVar5 >> 0x20) + __s->total_vehicle_kills;
        uVar5 = *(undefined8 *)((long)&p_Var11[0x14]._M_prev + 4);
        uVar3 = __s->total_building_kills;
        uVar7 = __s->total_defence_kills;
        __s->total_building_kills = uVar3 + (int)uVar5;
        __s->total_defence_kills = uVar7 + (int)((ulong)uVar5 >> 0x20);
        __s->total_captures = __s->total_captures + *(int *)((long)&p_Var11[0x16]._M_prev + 4);
        mVar18 = Server::getGameTime(server,player);
        iVar15 = *(int *)&p_Var11[0x16]._M_next;
        iVar13 = *(int *)((long)&p_Var11[0x16]._M_next + 4);
        iVar14 = *(int *)&p_Var11[0x16]._M_prev;
        __s->total_beacon_placements =
             __s->total_beacon_placements + *(int *)((long)&p_Var11[0x15]._M_prev + 4);
        __s->total_beacon_disarms = __s->total_beacon_disarms + iVar15;
        __s->total_proxy_placements = __s->total_proxy_placements + iVar13;
        __s->total_proxy_disarms = __s->total_proxy_disarms + iVar14;
        uVar4 = __s->total_game_time;
        uVar8 = __s->total_games;
        __s->total_game_time =
             uVar4 + ((int)(SUB168(SEXT816(mVar18.__r) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
                     (SUB164(SEXT816(mVar18.__r) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f));
        __s->total_games = uVar8 + 1;
        TVar9 = *(TeamType *)&p_Var11[0x10]._M_prev;
        if (TVar9 == Nod) {
          __s->total_nod_games = __s->total_nod_games + 1;
          local_70 = 200;
          local_78 = 0xc4;
          local_80 = 0xc0;
          local_88 = 0xbc;
          local_90 = 0xb8;
          local_98 = 0xb4;
          local_a0 = 0xb0;
          local_a8 = 0xac;
          local_b0 = 0xa8;
          lVar24 = 0x20;
          lVar25 = 0xa4;
          if (*team == None) {
            local_c0 = 0xcc;
            __s->total_nod_ties = __s->total_nod_ties + 1;
          }
          else {
            local_c0 = 0xcc;
            if (*team == Nod) {
              __s->total_wins = __s->total_wins + 1;
              __s->total_nod_wins = __s->total_nod_wins + 1;
            }
          }
LAB_001261ef:
          mVar18 = Server::getGameTime(server,player);
          piVar1 = (int *)((long)&__s->rank + lVar25);
          *piVar1 = *piVar1 + ((int)(SUB168(SEXT816(mVar18.__r) * SEXT816(0x20c49ba5e353f7cf),8) >>
                                    7) -
                              (SUB164(SEXT816(mVar18.__r) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f
                              ));
          uVar17 = (ulong)(double)p_Var11[0x11]._M_prev;
          plVar2 = (long *)((long)&__s->rank + lVar24);
          *plVar2 = *plVar2 + ((long)((double)p_Var11[0x11]._M_prev - 9.223372036854776e+18) &
                               (long)uVar17 >> 0x3f | uVar17);
          piVar1 = (int *)((long)&__s->rank + local_b0);
          *piVar1 = *piVar1 + *(int *)((long)&p_Var11[0x15]._M_prev + 4);
          piVar1 = (int *)((long)&__s->rank + local_a8);
          *piVar1 = *piVar1 + *(int *)&p_Var11[0x16]._M_next;
          piVar1 = (int *)((long)&__s->rank + local_a0);
          *piVar1 = *piVar1 + *(int *)((long)&p_Var11[0x16]._M_next + 4);
          piVar1 = (int *)((long)&__s->rank + local_98);
          *piVar1 = *piVar1 + *(int *)&p_Var11[0x16]._M_prev;
          piVar1 = (int *)((long)&__s->rank + local_90);
          *piVar1 = *piVar1 + *(int *)&p_Var11[0x13]._M_prev;
          piVar1 = (int *)((long)&__s->rank + local_88);
          *piVar1 = *piVar1 + *(int *)((long)&p_Var11[0x13]._M_prev + 4);
          piVar1 = (int *)((long)&__s->rank + local_80);
          *piVar1 = *piVar1 + *(int *)&p_Var11[0x14]._M_prev;
          piVar1 = (int *)((long)&__s->rank + local_78);
          *piVar1 = *piVar1 + *(int *)&p_Var11[0x15]._M_next;
          piVar1 = (int *)((long)&__s->rank + local_70);
          *piVar1 = *piVar1 + *(int *)((long)&p_Var11[0x14]._M_prev + 4);
          iVar15 = *(int *)((long)&p_Var11[0x14]._M_next + 4);
LAB_001262ea:
          piVar1 = (int *)((long)&__s->rank + local_c0);
          *piVar1 = *piVar1 + iVar15;
        }
        else {
          if (TVar9 == GDI) {
            __s->total_gdi_games = __s->total_gdi_games + 1;
            local_70 = 0x90;
            local_78 = 0x8c;
            local_80 = 0x88;
            local_88 = 0x84;
            local_90 = 0x80;
            local_98 = 0x7c;
            local_a0 = 0x78;
            local_a8 = 0x74;
            local_b0 = 0x70;
            lVar24 = 0x18;
            lVar25 = 0x6c;
            if (*team == None) {
              local_c0 = 0x94;
              __s->total_gdi_ties = __s->total_gdi_ties + 1;
            }
            else {
              local_c0 = 0x94;
              if (*team == GDI) {
                __s->total_wins = __s->total_wins + 1;
                __s->total_gdi_wins = __s->total_gdi_wins + 1;
              }
            }
            goto LAB_001261ef;
          }
          if (TVar9 == *team) {
            iVar15 = 1;
            local_c0 = 0x4c;
            goto LAB_001262ea;
          }
        }
        uVar23 = (uint)(long)(double)p_Var11[0x11]._M_prev;
        if (__s->top_score < uVar23) {
          __s->top_score = uVar23;
        }
        if (__s->top_kills < *(uint *)&p_Var11[0x13]._M_prev) {
          __s->top_kills = *(uint *)&p_Var11[0x13]._M_prev;
        }
        uVar23 = *(uint *)((long)&p_Var11[0x13]._M_prev + 4);
        if (__s->most_deaths < uVar23) {
          __s->most_deaths = uVar23;
        }
        uVar23 = *(uint *)((long)&p_Var11[0x14]._M_next + 4);
        if (__s->top_headshot_kills < uVar23) {
          __s->top_headshot_kills = uVar23;
        }
        if (__s->top_vehicle_kills < *(uint *)&p_Var11[0x14]._M_prev) {
          __s->top_vehicle_kills = *(uint *)&p_Var11[0x14]._M_prev;
        }
        uVar23 = *(uint *)((long)&p_Var11[0x14]._M_prev + 4);
        if (__s->top_building_kills < uVar23) {
          __s->top_building_kills = uVar23;
        }
        if (__s->top_defence_kills < *(uint *)&p_Var11[0x15]._M_next) {
          __s->top_defence_kills = *(uint *)&p_Var11[0x15]._M_next;
        }
        uVar23 = *(uint *)((long)&p_Var11[0x16]._M_prev + 4);
        if (__s->top_captures < uVar23) {
          __s->top_captures = uVar23;
        }
        mVar18 = Server::getGameTime(server,player);
        in_RCX = 0x20c49ba5e353f7cf;
        uVar23 = (int)(SUB168(SEXT816(mVar18.__r) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
                 (SUB164(SEXT816(mVar18.__r) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f);
        if (__s->top_game_time < uVar23) {
          __s->top_game_time = uVar23;
        }
        uVar23 = *(uint *)((long)&p_Var11[0x15]._M_prev + 4);
        if (__s->top_beacon_placements < uVar23) {
          __s->top_beacon_placements = uVar23;
        }
        if (__s->top_beacon_disarms < *(uint *)&p_Var11[0x16]._M_next) {
          __s->top_beacon_disarms = *(uint *)&p_Var11[0x16]._M_next;
        }
        uVar23 = *(uint *)((long)&p_Var11[0x16]._M_next + 4);
        if (__s->top_proxy_placements < uVar23) {
          __s->top_proxy_placements = uVar23;
        }
        if (__s->top_proxy_disarms < *(uint *)&p_Var11[0x16]._M_prev) {
          __s->top_proxy_disarms = *(uint *)&p_Var11[0x16]._M_prev;
        }
        __s->most_recent_ip = *(uint32_t *)&p_Var11[0x10]._M_next;
        tVar19 = time((time_t *)0x0);
        __s->last_game = tVar19;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&__s->most_recent_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &p_Var11[1]._M_prev);
      }
    }
    lVar24 = std::chrono::_V2::steady_clock::now();
    sort_entries(this);
    lVar25 = std::chrono::_V2::steady_clock::now();
    lVar20 = std::chrono::_V2::steady_clock::now();
    auVar26 = Jupiter::Database::getFilename_abi_cxx11_();
    write(this,(int)*auVar26._0_8_,auVar26._8_8_,in_RCX);
    lVar21 = std::chrono::_V2::steady_clock::now();
    if (this->m_output_times != false) {
      string_printf_abi_cxx11_
                (&local_50,
                 "Ladder: %zu entries sorted in %f seconds; Database written in %f seconds.\r\n",
                 (double)(lVar25 - lVar24) * 1e-09,(double)(lVar21 - lVar20) * 1e-09,this->m_entries
                );
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length
                          );
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
      std::ostream::put((char)poVar22);
      std::ostream::flush();
      msg._M_str = local_50._M_dataplus._M_p;
      msg._M_len = local_50._M_string_length;
      Server::sendLogChan(server,msg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void RenX::LadderDatabase::updateLadder(RenX::Server &server, const RenX::TeamType &team) {
	if (server.players.size() != server.getBotCount()) {
		// call the PreUpdateLadder event
		if (this->OnPreUpdateLadder != nullptr) {
			this->OnPreUpdateLadder(*this, server, team);
		}

		// update player stats in memory
		Entry *entry;
		for (auto player = server.players.begin(); player != server.players.end(); ++player) {
			if (player->steamid != 0 && (player->ban_flags & RenX::BanDatabase::Entry::FLAG_TYPE_LADDER) == 0) {
				entry = getPlayerEntry(player->steamid);
				if (entry == nullptr) {
					entry = new Entry();
					append(entry);
					entry->steam_id = player->steamid;
				}

				entry->total_score += static_cast<uint64_t>(player->score);

				entry->total_kills += player->kills;
				entry->total_deaths += player->deaths;
				entry->total_headshot_kills += player->headshots;
				entry->total_vehicle_kills += player->vehicleKills;
				entry->total_building_kills += player->buildingKills;
				entry->total_defence_kills += player->defenceKills;
				entry->total_captures += player->captures;
				entry->total_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
				entry->total_beacon_placements += player->beaconPlacements;
				entry->total_beacon_disarms += player->beaconDisarms;
				entry->total_proxy_placements += player->proxy_placements;
				entry->total_proxy_disarms += player->proxy_disarms;

				++entry->total_games;
				switch (player->team) {
				case RenX::TeamType::GDI:
					++entry->total_gdi_games;
					if (player->team == team)
						++entry->total_wins, ++entry->total_gdi_wins;
					else if (team == RenX::TeamType::None)
						++entry->total_gdi_ties;

					entry->total_gdi_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
					entry->total_gdi_score += static_cast<uint64_t>(player->score);
					entry->total_gdi_beacon_placements += player->beaconPlacements;
					entry->total_gdi_beacon_disarms += player->beaconDisarms;
					entry->total_gdi_proxy_placements += player->proxy_placements;
					entry->total_gdi_proxy_disarms += player->proxy_disarms;
					entry->total_gdi_kills += player->kills;
					entry->total_gdi_deaths += player->deaths;
					entry->total_gdi_vehicle_kills += player->vehicleKills;
					entry->total_gdi_defence_kills += player->defenceKills;
					entry->total_gdi_building_kills += player->buildingKills;
					entry->total_gdi_headshots += player->headshots;
					break;
				case RenX::TeamType::Nod:
					++entry->total_nod_games;
					if (player->team == team)
						++entry->total_wins, ++entry->total_nod_wins;
					else if (team == RenX::TeamType::None)
						++entry->total_nod_ties;

					entry->total_nod_game_time += static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count());
					entry->total_nod_score += static_cast<uint64_t>(player->score);
					entry->total_nod_beacon_placements += player->beaconPlacements;
					entry->total_nod_beacon_disarms += player->beaconDisarms;
					entry->total_nod_proxy_placements += player->proxy_placements;
					entry->total_nod_proxy_disarms += player->proxy_disarms;
					entry->total_nod_kills += player->kills;
					entry->total_nod_deaths += player->deaths;
					entry->total_nod_vehicle_kills += player->vehicleKills;
					entry->total_nod_defence_kills += player->defenceKills;
					entry->total_nod_building_kills += player->buildingKills;
					entry->total_nod_headshots += player->headshots;
					break;
				default:
					if (player->team == team)
						++entry->total_wins;
					break;
				}

				auto set_if_greater = [](uint32_t &src, const uint32_t &cmp) {
					if (cmp > src) {
						src = cmp;
					}
				};

				set_if_greater(entry->top_score, static_cast<uint32_t>(player->score));
				set_if_greater(entry->top_kills, player->kills);
				set_if_greater(entry->most_deaths, player->deaths);
				set_if_greater(entry->top_headshot_kills, player->headshots);
				set_if_greater(entry->top_vehicle_kills, player->vehicleKills);
				set_if_greater(entry->top_building_kills, player->buildingKills);
				set_if_greater(entry->top_defence_kills, player->defenceKills);
				set_if_greater(entry->top_captures, player->captures);
				set_if_greater(entry->top_game_time, static_cast<uint32_t>(std::chrono::duration_cast<std::chrono::seconds>(server.getGameTime(*player)).count()));
				set_if_greater(entry->top_beacon_placements, player->beaconPlacements);
				set_if_greater(entry->top_beacon_disarms, player->beaconDisarms);
				set_if_greater(entry->top_proxy_placements, player->proxy_placements);
				set_if_greater(entry->top_proxy_disarms, player->proxy_disarms);

				entry->most_recent_ip = player->ip32;
				entry->last_game = time(nullptr);
				entry->most_recent_name = player->name;
			}
		}

		// sort new stats
		std::chrono::steady_clock::time_point start_time = std::chrono::steady_clock::now();
		sort_entries();
		std::chrono::steady_clock::duration sort_duration = std::chrono::steady_clock::now() - start_time;

		// write new stats
		start_time = std::chrono::steady_clock::now();
		write(this->getFilename());
		std::chrono::steady_clock::duration write_duration = std::chrono::steady_clock::now() - start_time;

		if (m_output_times)
		{
			std::string str = string_printf("Ladder: %zu entries sorted in %f seconds; Database written in %f seconds." ENDL,
				getEntries(),
				static_cast<double>(sort_duration.count()) * (static_cast<double>(std::chrono::steady_clock::duration::period::num) / static_cast<double>(std::chrono::steady_clock::duration::period::den) * static_cast<double>(std::chrono::seconds::duration::period::den / std::chrono::seconds::duration::period::num)),
				static_cast<double>(write_duration.count()) * (static_cast<double>(std::chrono::steady_clock::duration::period::num) / static_cast<double>(std::chrono::steady_clock::duration::period::den) * static_cast<double>(std::chrono::seconds::duration::period::den / std::chrono::seconds::duration::period::num)));
			std::cout << str << std::endl;
			server.sendLogChan(str);
		}
	}
}